

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

int Saig_DetectTryPolarity
              (sat_solver *pSat,int nConfs,int nProps,Cnf_Dat_t *pCnf,Aig_Obj_t *pObj,int iPol,
              Vec_Ptr_t *vInfo,int *piPat,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int local_28;
  int local_24;
  
  pVVar2 = pCnf->pMan->vCos;
  if (0 < pVVar2->nSize) {
    local_28 = pCnf->pVarNums[*(int *)((long)*pVVar2->pArray + 0x24)] * 2;
    local_24 = (uint)(iPol == 0) + pCnf->pVarNums[pObj->Id] * 2;
    iVar3 = sat_solver_solve(pSat,&local_28,(lit *)&stack0xffffffffffffffe0,(long)nConfs,
                             (long)nProps,0,0);
    if (iVar3 == -1) {
      iVar3 = 1;
    }
    else if (iVar3 == 1) {
      Saig_CollectSatValues(pSat,pCnf,vInfo,piPat);
      iVar1 = *piPat;
      *piPat = iVar1 + 1;
      if (vInfo->nSize < 2) goto LAB_0064af54;
      iVar3 = 0;
      if (iVar1 + 1 == (*(int *)(vInfo->pArray + 1) - *(int *)vInfo->pArray & 0x1ffffffcU) << 3) {
        if (fVerbose != 0) {
          puts("Warning: Reached the limit on the number of patterns.");
        }
        *piPat = 0;
      }
    }
    else {
      if (iVar3 != 0) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                      ,0x220,
                      "int Saig_DetectTryPolarity(sat_solver *, int, int, Cnf_Dat_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *, int)"
                     );
      }
      iVar3 = 0;
    }
    return iVar3;
  }
LAB_0064af54:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_DetectTryPolarity( sat_solver * pSat, int nConfs, int nProps, Cnf_Dat_t * pCnf, Aig_Obj_t * pObj, int iPol, Vec_Ptr_t * vInfo, int * piPat, int fVerbose )
{
    Aig_Obj_t * pOut = Aig_ManCo( pCnf->pMan, 0 );
    int status, Lits[2];
//    ABC_INT64_T nOldConfs = pSat->stats.conflicts;
//    ABC_INT64_T nOldImps = pSat->stats.propagations;
    Lits[0] = toLitCond( pCnf->pVarNums[Aig_ObjId(pOut)], 0 );
    Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !iPol );
    status = sat_solver_solve( pSat, Lits, Lits + 2, (ABC_INT64_T)nConfs, (ABC_INT64_T)nProps, 0, 0 );
    if ( status == l_False )
    {
//        printf( "u%d(%d) ", (int)(pSat->stats.conflicts-nOldConfs), (int)(pSat->stats.propagations-nOldImps) );
        return 1;
    }
    if ( status == l_Undef )
    {
//        printf( "Solver returned undecided.\n" );
        return 0;
    }
//    printf( "s%d(%d) ", (int)(pSat->stats.conflicts-nOldConfs), (int)(pSat->stats.propagations-nOldImps) );
    assert( status == l_True );
    Saig_CollectSatValues( pSat, pCnf, vInfo, piPat );
    (*piPat)++;
    if ( *piPat == Vec_PtrReadWordsSimInfo(vInfo) * 32 )
    {
        if ( fVerbose )
            printf( "Warning: Reached the limit on the number of patterns.\n" );
        *piPat = 0;
    }
    return 0;
}